

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O2

void __thiscall soul::PoolAllocator::Pool::~Pool(Pool *this)

{
  char *pcVar1;
  code *pcVar2;
  ulong uVar3;
  
  for (uVar3 = 0; uVar3 < this->nextSlot; uVar3 = uVar3 + *(long *)pcVar1) {
    pcVar1 = (this->space)._M_elems + uVar3;
    pcVar2 = *(code **)((this->space)._M_elems + uVar3 + 8);
    if (pcVar2 != (code *)0x0) {
      (*pcVar2)(pcVar1 + 0x10);
    }
  }
  return;
}

Assistant:

~Pool()
        {
            for (size_t i = 0; i < nextSlot;)
            {
                auto item = getItem (i);

                if (item->destructor != nullptr)
                    item->destructor (&item->item);

                i += item->size;
            }
        }